

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> * __thiscall
capnp::anon_unknown_0::BrokenClient::whenMoreResolved
          (Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> *__return_storage_ptr__,
          BrokenClient *this)

{
  Disposer *local_178;
  PromiseNode *pPStack_170;
  Exception local_168;
  
  if (this->resolved == true) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    kj::Exception::Exception(&local_168,&this->exception);
    kj::heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_178,&local_168);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.disposer = local_178;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.ptr = pPStack_170;
    kj::Exception::~Exception(&local_168);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    if (resolved) {
      return nullptr;
    } else {
      return kj::Promise<kj::Own<ClientHook>>(kj::cp(exception));
    }
  }